

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O0

bool __thiscall svg::Document::save(Document *this)

{
  byte bVar1;
  undefined8 uVar2;
  ofstream ofs;
  Document *in_stack_00000308;
  string local_240 [32];
  undefined4 local_220;
  ostream local_210 [527];
  byte local_1;
  
  uVar2 = std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_210,uVar2,0x10);
  bVar1 = std::ios::good();
  local_1 = (bVar1 & 1) != 0;
  if ((bool)local_1) {
    toString_abi_cxx11_(in_stack_00000308);
    std::operator<<(local_210,local_240);
    std::__cxx11::string::~string(local_240);
    std::ofstream::close();
  }
  local_220 = 1;
  std::ofstream::~ofstream(local_210);
  return (bool)(local_1 & 1);
}

Assistant:

bool save() const
        {
            std::ofstream ofs(file_name.c_str());
            if (!ofs.good())
                return false;

            ofs << toString();
            ofs.close();
            return true;
        }